

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O3

void __thiscall
libtorrent::piece_picker::record_downloading_piece(piece_picker *this,piece_index_t p)

{
  iterator __position;
  pointer ppVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>_>
  _Var5;
  int iVar6;
  int iVar7;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> piece;
  long lVar8;
  piece_extent_t this_extent;
  strong_typedef<int,_libtorrent::piece_extent_tag,_void> local_24;
  
  if (this->m_blocks_per_piece < 0x100) {
    local_24.m_val = p.m_val / (int)(0x100 / this->m_blocks_per_piece);
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::piece_extent_tag,void>*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::piece_extent_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::piece_extent_tag,void>>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::strong_typedef<int,libtorrent::piece_extent_tag,void>const>>
                      ((this->m_recent_extents).
                       super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->m_recent_extents).
                       super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    __position._M_current =
         (this->m_recent_extents).
         super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (_Var5._M_current == __position._M_current) {
      ppVar1 = (this->m_piece_map).
               super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
               .
               super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar2 = 0x100 / this->m_blocks_per_piece;
      iVar7 = local_24.m_val * uVar2;
      iVar4 = uVar2 + iVar7;
      iVar6 = (int)((ulong)((long)(this->m_piece_map).
                                  super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                                  .
                                  super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) >> 3);
      if (iVar6 <= iVar4) {
        iVar4 = iVar6;
      }
      if (iVar7 != iVar4) {
        lVar8 = (long)iVar7;
        bVar3 = true;
        do {
          if (lVar8 != p.m_val) {
            if (0x1fffffff < (*(uint *)(ppVar1 + lVar8) ^ *(uint *)(ppVar1 + p.m_val))) {
              return;
            }
            bVar3 = (bool)(bVar3 & ((prio_index_t *)((long)(ppVar1 + lVar8) + 4))->m_val == -1);
          }
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 != iVar4);
        if ((!bVar3) &&
           ((ulong)((long)_Var5._M_current -
                   (long)(this->m_recent_extents).
                         super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0x11)) {
          if (_Var5._M_current ==
              (this->m_recent_extents).
              super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<libtorrent::aux::strong_typedef<int,libtorrent::piece_extent_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::piece_extent_tag,void>>>
            ::
            _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::piece_extent_tag,void>const&>
                      ((vector<libtorrent::aux::strong_typedef<int,libtorrent::piece_extent_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::piece_extent_tag,void>>>
                        *)&this->m_recent_extents,__position,&local_24);
          }
          else {
            (__position._M_current)->m_val = local_24.m_val;
            (this->m_recent_extents).
            super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void piece_picker::record_downloading_piece(piece_index_t const p)
	{
		// if a single piece is large enough, don't bother with the affinity of
		// adjecent pieces.
		if (m_blocks_per_piece >= max_piece_affinity_extent) return;

		piece_extent_t const this_extent = extent_for(p);

		// if the extent is already in the list, nothing to do
		if (std::find(m_recent_extents.begin()
			, m_recent_extents.end(), this_extent) != m_recent_extents.end())
			return;

		download_priority_t const this_prio = piece_priority(p);

		// figure out if it's worth recording this downloading piece
		// if we already have all blocks in this extent, there's no point in
		// adding it
		bool have_all = true;

		for (auto const piece : extent_for(this_extent))
		{
			if (piece == p) continue;

			if (!m_piece_map[piece].have()) have_all = false;

			// if at least one piece in this extent has a different priority than
			// the one we just started downloading, don't create an affinity for
			// adjecent pieces. This probably means the pieces belong to different
			// files, or that some other mechanism determining the priority should
			// take precedence.
			if (piece_priority(piece) != this_prio) return;
		}

		// if we already have all the *other* pieces in this extent, there's no
		// need to inflate their priorities
		if (have_all) return;

		// TODO: should 5 be configurable?
		if (m_recent_extents.size() < 5)
			m_recent_extents.push_back(this_extent);

		// limit the number of extent affinities active at any given time to limit
		// the cost of checking them. Also, don't replace them, commit to
		// finishing them before starting another extent. This is analoguous to
		// limiting the number of partial pieces.
	}